

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ruby_generator.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::ruby::StringifySyntax_abi_cxx11_
          (string *__return_storage_ptr__,ruby *this,Syntax syntax)

{
  LogMessage *other;
  char *pcVar1;
  LogFinisher local_49;
  LogMessage local_48;
  
  if ((int)this == 3) {
    pcVar1 = "proto3";
  }
  else if ((int)this == 2) {
    pcVar1 = "proto2";
  }
  else {
    internal::LogMessage::LogMessage
              (&local_48,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/compiler/ruby/ruby_generator.cc"
               ,0x78);
    other = internal::LogMessage::operator<<
                      (&local_48,
                       "Unsupported syntax; this generator only supports proto2 and proto3 syntax.")
    ;
    internal::LogFinisher::operator=(&local_49,other);
    internal::LogMessage::~LogMessage(&local_48);
    pcVar1 = "";
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,(allocator *)&local_48);
  return __return_storage_ptr__;
}

Assistant:

string StringifySyntax(FileDescriptor::Syntax syntax) {
  switch (syntax) {
    case FileDescriptor::SYNTAX_PROTO2:
      return "proto2";
    case FileDescriptor::SYNTAX_PROTO3:
      return "proto3";
    case FileDescriptor::SYNTAX_UNKNOWN:
    default:
      GOOGLE_LOG(FATAL) << "Unsupported syntax; this generator only supports "
                           "proto2 and proto3 syntax.";
      return "";
  }
}